

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O0

void parseVersionFromName(StringRef Name,uint *Major,uint *Minor,uint *Micro)

{
  char cVar1;
  uint uVar2;
  char *__n;
  unsigned_long *puVar3;
  uint *puVar4;
  bool bVar5;
  uint local_ec;
  uint *puStack_e8;
  uint i;
  uint *Components [3];
  uint *Micro_local;
  uint *Minor_local;
  uint *Major_local;
  StringRef Name_local;
  unsigned_long local_70 [3];
  uint **local_58;
  undefined1 local_50 [16];
  char *local_40;
  char *local_38;
  uint *local_30;
  int local_24;
  char *local_20;
  uint *local_18;
  undefined1 *local_10;
  
  Name_local.Data = (char *)Name.Length;
  Major_local = (uint *)Name.Data;
  *Micro = 0;
  *Minor = 0;
  *Major = 0;
  local_ec = 0;
  puStack_e8 = Major;
  Components[0] = Minor;
  Components[1] = Micro;
  while ((((local_ec != 3 && (Name_local.Data != (char *)0x0)) &&
          (cVar1 = llvm::StringRef::operator[]((StringRef *)&Major_local,0), '/' < cVar1)) &&
         (cVar1 = llvm::StringRef::operator[]((StringRef *)&Major_local,0), cVar1 < ':'))) {
    uVar2 = EatNumber((StringRef *)&Major_local);
    **(uint **)((long)&stack0xffffffffffffff18 + (ulong)local_ec * 8) = uVar2;
    Name_local.Length = (long)"-%%%%%%." + 7;
    __n = (char *)strlen(".");
    bVar5 = false;
    if (__n <= Name_local.Data) {
      local_30 = Major_local;
      local_38 = ".";
      local_40 = __n;
      if (__n == (char *)0x0) {
        local_24 = 0;
      }
      else {
        local_24 = memcmp(Major_local,".",(size_t)__n);
      }
      bVar5 = local_24 == 0;
    }
    if (bVar5) {
      local_58 = &Major_local;
      local_70[2] = 1;
      local_70[1] = 0xffffffffffffffff;
      puVar3 = std::min<unsigned_long>(local_70 + 2,(unsigned_long *)&Name_local);
      local_70[2] = *puVar3;
      puVar4 = (uint *)((long)Major_local + local_70[2]);
      local_70[0] = (long)Name_local.Data - local_70[2];
      puVar3 = std::min<unsigned_long>(local_70 + 1,local_70);
      Name_local.Data = (char *)*puVar3;
      local_10 = local_50;
      Major_local = puVar4;
      local_20 = Name_local.Data;
      local_18 = puVar4;
    }
    local_ec = local_ec + 1;
  }
  return;
}

Assistant:

static void parseVersionFromName(StringRef Name, unsigned &Major,
                                 unsigned &Minor, unsigned &Micro) {
  // Any unset version defaults to 0.
  Major = Minor = Micro = 0;

  // Parse up to three components.
  unsigned *Components[3] = {&Major, &Minor, &Micro};
  for (unsigned i = 0; i != 3; ++i) {
    if (Name.empty() || Name[0] < '0' || Name[0] > '9')
      break;

    // Consume the leading number.
    *Components[i] = EatNumber(Name);

    // Consume the separator, if present.
    if (Name.startswith("."))
      Name = Name.substr(1);
  }
}